

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall kratos::PortPackedVisitor::visit(PortPackedVisitor *this,Generator *generator)

{
  PackedStruct *struct_def;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  pointer pbVar2;
  shared_ptr<kratos::PortPackedStruct> sVar3;
  shared_ptr<kratos::VarPackedStruct> sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  PortPackedVisitor *local_68;
  PackedStruct *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [8];
  shared_ptr<kratos::Var> var;
  shared_ptr<kratos::PortPackedStruct> ptr;
  
  local_68 = this;
  Generator::get_all_var_names_abi_cxx11_(&local_80,generator);
  for (pbVar2 = local_80.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_80.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    Generator::get_var((Generator *)local_50,(string *)generator);
    iVar1 = (*((IRNode *)local_50)->_vptr_IRNode[0x17])();
    if ((char)iVar1 != '\0') {
      if (*(VarType *)((long)local_50 + 0x168) == PortIO) {
        sVar3 = Var::as<kratos::PortPackedStruct>
                          ((Var *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
        (*(var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x2e])
                  (&local_60,
                   var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   ,sVar3.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._M_pi);
      }
      else {
        sVar4 = Var::as<kratos::VarPackedStruct>
                          ((Var *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
        (*(var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x2d])
                  (&local_60,
                   var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   ,sVar4.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._M_pi);
      }
      this_00 = local_58;
      struct_def = local_60;
      if (ptr.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ptr.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      if (struct_def->external == false) {
        process_struct_(local_68,struct_def,(Var *)local_50);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& var_names = generator->get_all_var_names();
        for (auto const& var_name : var_names) {
            auto var = generator->get_var(var_name);
            if (var->is_struct()) {
                std::shared_ptr<PackedStruct> struct_def;
                if (var->type() == VarType::PortIO) {
                    auto ptr = var->as<PortPackedStruct>();
                    struct_def = ptr->packed_struct();
                } else {
                    auto ptr = var->as<VarPackedStruct>();
                    struct_def = ptr->packed_struct();
                }
                if (struct_def->external) continue;
                process_struct_(struct_def.get(), var.get());
            }
        }
    }